

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

void __thiscall Fossilize::StreamArchive::resolve_path(StreamArchive *this,string *read_only_part)

{
  string *this_00;
  char cVar1;
  int iVar2;
  char cmpstr [11];
  string local_70;
  string local_50;
  undefined7 local_30;
  undefined4 uStack_29;
  
  local_30 = 0x74656b63756224;
  uStack_29 = 0x726964;
  this_00 = &this->path;
  iVar2 = std::__cxx11::string::compare((ulong)this_00,0,&DAT_0000000a);
  if (((iVar2 == 0) && (10 < (this->path)._M_string_length)) &&
     ((cVar1 = (this_00->_M_dataplus)._M_p[10], cVar1 == '\\' || (cVar1 == '/')))) {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)this_00);
    Path::relpath(&local_50,read_only_part,&local_70);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void resolve_path(const std::string &read_only_part)
	{
		constexpr char cmpstr[] = "$bucketdir";
		constexpr size_t offset = sizeof(cmpstr) - 1;
		if (path.compare(0, offset, cmpstr) == 0 &&
		    path.size() > offset &&
		    (path[offset] == '/' || path[offset] == '\\'))
		{
			path = Path::relpath(read_only_part, path.substr(offset + 1));
		}
	}